

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrientationError.h
# Opt level: O0

OrientationError * __thiscall
KDIS::DATA_TYPE::OrientationError::operator=(OrientationError *this,OrientationError *param_1)

{
  KFIXED<short,_(unsigned_char)__b_> local_88;
  KFIXED<short,_(unsigned_char)__b_> local_78;
  KFIXED<short,_(unsigned_char)__b_> local_68;
  KFIXED<short,_(unsigned_char)__b_> local_58 [2];
  KFIXED<short,_(unsigned_char)__b_> local_38;
  KFIXED<short,_(unsigned_char)__b_> local_28;
  OrientationError *local_18;
  OrientationError *param_1_local;
  OrientationError *this_local;
  
  local_18 = param_1;
  param_1_local = this;
  DataTypeBase::operator=(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  KFIXED<short,_(unsigned_char)'\b'>::KFIXED(&local_38,&local_18->m_AziErr);
  KFIXED<short,_(unsigned_char)'\b'>::operator=(&local_28,&this->m_AziErr);
  KFIXED<short,_(unsigned_char)'\b'>::~KFIXED(&local_28);
  KFIXED<short,_(unsigned_char)'\b'>::~KFIXED(&local_38);
  KFIXED<short,_(unsigned_char)'\b'>::KFIXED(&local_68,&local_18->m_ElvErr);
  KFIXED<short,_(unsigned_char)'\b'>::operator=(local_58,&this->m_ElvErr);
  KFIXED<short,_(unsigned_char)'\b'>::~KFIXED(local_58);
  KFIXED<short,_(unsigned_char)'\b'>::~KFIXED(&local_68);
  KFIXED<short,_(unsigned_char)'\b'>::KFIXED(&local_88,&local_18->m_RotErr);
  KFIXED<short,_(unsigned_char)'\b'>::operator=(&local_78,&this->m_RotErr);
  KFIXED<short,_(unsigned_char)'\b'>::~KFIXED(&local_78);
  KFIXED<short,_(unsigned_char)'\b'>::~KFIXED(&local_88);
  return this;
}

Assistant:

class KDIS_EXPORT OrientationError : public DataTypeBase
{
protected:

    KFIXED16_8 m_AziErr;

    KFIXED16_8 m_ElvErr;

    KFIXED16_8 m_RotErr;

public:

    static const KUINT16 ORIENTATION_ERROR_SIZE = 6;

    OrientationError();

    OrientationError( KFIXED16_8 Azimuth, KFIXED16_8 Elevation, KFIXED16_8 Rotation );

    OrientationError(KDataStream &stream) noexcept(false);

    virtual ~OrientationError();

    //************************************
    // FullName:    KDIS::DATA_TYPE::OrientationError::SetAzimuthError
    //              KDIS::DATA_TYPE::OrientationError::GetAzimuthError
    // Description: Azimuth orientation error in radians.
    // Parameter:   KFIXED16_8 AE
    //************************************
    void SetAzimuthError( KFIXED16_8 AE );
    KFIXED16_8 GetAzimuthError() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::OrientationError::SetElevationError
    //              KDIS::DATA_TYPE::OrientationError::GetElevationError
    // Description: Elevation orientation error in radians.
    // Parameter:   KFIXED16_8 EE
    //************************************
    void SetElevationError( KFIXED16_8 EE );
    KFIXED16_8 GetElevationError() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::OrientationError::SetRotationError
    //              KDIS::DATA_TYPE::OrientationError::GetRotationError
    // Description: Rotation orientation error in radians.
    // Parameter:   KFIXED16_8 RE
    //************************************
    void SetRotationError( KFIXED16_8 RE );
    KFIXED16_8 GetRotationError() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::OrientationError::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::DataTypeBase::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::OrientationError::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const OrientationError & Value ) const;
    KBOOL operator != ( const OrientationError & Value ) const;
}